

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&>
          (ValidationContext *this,IssueError *issue,uint *args,uchar *args_1,uchar *args_2,
          uchar *args_3,uchar *args_4,uchar *args_5,uchar *args_6,uchar *args_7,uchar *args_8)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  format_args args_00;
  string_view fmt;
  underlying_type_t<ktx::ReturnCode> uVar1;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  uint *in_RCX;
  v10 *in_RDX;
  char *unaff_RBX;
  undefined1 *in_RSI;
  long in_RDI;
  uchar *in_R8;
  uchar *in_R9;
  size_t unaff_R14;
  uchar *in_stack_00000008;
  ValidationReport *in_stack_00000010;
  ValidationReport *in_stack_00000018;
  uchar *in_stack_00000020;
  uchar *in_stack_00000028;
  basic_string_view<char> *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  uchar *args_8_00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 local_248;
  undefined8 local_240;
  undefined1 local_221 [41];
  uchar auStack_1f8 [32];
  uchar *local_1d8;
  uchar *local_1d0;
  uint *local_1c8;
  v10 *local_1c0;
  undefined1 *local_1b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  local_1a8;
  undefined8 local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_108;
  uchar *local_f0;
  uchar *local_c8;
  uchar *local_c0;
  uint *local_b8;
  v10 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uchar *local_98;
  longlong local_90;
  undefined8 local_88;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_50;
  undefined8 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_40;
  undefined8 local_38;
  undefined8 *local_30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar2;
  
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  local_1d8 = in_R9;
  local_1d0 = in_R8;
  local_1c8 = in_RCX;
  local_1c0 = in_RDX;
  local_1b8 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
  local_221[1] = *local_1b8;
  local_221._3_2_ = *(undefined2 *)(local_1b8 + 2);
  __a = (allocator<char> *)(local_221 + 9);
  __t = (basic_string_view<char,_std::char_traits<char>_> *)(local_1b8 + 8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_00,__t,__a);
  args_8_00 = auStack_1f8;
  local_80.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)(local_1b8 + 0x18);
  local_78 = &local_248;
  local_90 = ((local_80.values_)->field_0).long_long_value;
  local_88 = *(undefined8 *)(local_1b8 + 0x20);
  s._M_str = in_stack_fffffffffffffd80;
  s._M_len = in_stack_fffffffffffffd78;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            (in_stack_fffffffffffffd70,s);
  local_a8 = local_248;
  uStack_a0 = local_240;
  local_b0 = local_1c0;
  local_b8 = local_1c8;
  local_c0 = local_1d0;
  local_c8 = local_1d8;
  local_f0 = in_stack_00000028;
  local_70 = &local_a8;
  local_98 = args_8_00;
  aVar2 = local_80;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const>
            (&local_1a8,local_1c0,local_1c8,local_1d0,local_1d8,in_stack_00000008,
             &in_stack_00000010->type,&in_stack_00000018->type,in_stack_00000020,in_stack_00000028,
             args_8_00);
  local_48 = &local_110;
  local_50 = &local_1a8;
  local_38 = 0x222222222;
  local_110 = 0x222222222;
  fmt.size_ = unaff_R14;
  fmt.data_ = unaff_RBX;
  args_00.field_1.values_ = aVar2.values_;
  args_00.desc_ = (unsigned_long_long)local_50;
  local_40 = local_50;
  local_30 = local_48;
  local_108 = local_50;
  ::fmt::v10::vformat_abi_cxx11_(fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_00000018,in_stack_00000010);
  ValidationReport::~ValidationReport(in_stack_00000018);
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }